

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_flac__read_next_flac_frame_header
                    (ma_dr_flac_bs *bs,ma_uint8 streaminfoBitsPerSample,
                    ma_dr_flac_frame_header *header)

{
  ma_uint16 mVar1;
  ulong uVar2;
  ulong uVar3;
  ma_dr_flac_cache_t mVar4;
  ma_uint16 *pmVar5;
  ma_uint8 mVar6;
  ma_bool32 mVar7;
  ma_bool32 mVar8;
  ma_result mVar9;
  int iVar10;
  uint uVar11;
  ma_uint32 mVar12;
  uint uVar13;
  ma_bool32 unaff_EBX;
  ulong uVar14;
  byte bVar15;
  undefined7 in_register_00000031;
  byte bVar16;
  char cVar17;
  ma_dr_flac_frame_header *pmVar18;
  bool bVar19;
  ma_uint8 crc8;
  ma_uint8 reserved;
  ma_uint8 bitsPerSample;
  ma_uint8 channelAssignment;
  ma_uint8 sampleRate;
  ma_uint8 blockSize;
  ma_uint8 blockingStrategy;
  ma_uint8 hi;
  byte local_7e;
  byte local_7d;
  ma_bool32 local_7c;
  byte local_78;
  byte local_77;
  byte local_76;
  byte local_75;
  byte local_74;
  byte local_73;
  byte local_72;
  ma_uint8 local_71;
  ma_dr_flac_frame_header *local_70;
  ulong local_68;
  ma_uint64 local_60;
  uint local_58;
  undefined4 local_54;
  ma_uint8 *local_50;
  ulong local_48;
  ulong local_40;
  ma_uint16 *local_38;
  
  local_54 = (undefined4)CONCAT71(in_register_00000031,streaminfoBitsPerSample);
  local_38 = &header->blockSizeInPCMFrames;
  local_50 = &header->crc8;
  local_70 = header;
  local_7c = unaff_EBX;
  do {
    local_7e = 0xce;
    local_7d = 0;
    local_74 = 0;
    local_75 = 0;
    local_76 = 0;
    local_77 = 0;
    local_78 = 0;
    mVar7 = ma_dr_flac__seek_bits(bs,(ulong)(-bs->consumedBits & 7));
    cVar17 = '\x01';
    mVar8 = 0;
    if (mVar7 != 0) {
      do {
        bs->crc16 = 0;
        bs->crc16CacheIgnoredBytes = bs->consumedBits >> 3;
        mVar8 = ma_dr_flac__read_uint8(bs,8,(ma_uint8 *)&local_60);
        if (mVar8 == 0) {
LAB_0018890d:
          cVar17 = '\0';
LAB_00188910:
          bVar19 = false;
        }
        else {
          bVar19 = true;
          if ((char)local_60 == -1) {
            mVar8 = ma_dr_flac__read_uint8(bs,6,&local_71);
            if (mVar8 == 0) goto LAB_0018890d;
            if (local_71 != '>') {
              mVar8 = ma_dr_flac__seek_bits(bs,(ulong)(-bs->consumedBits & 7));
              bVar19 = mVar8 != 0;
              if (!bVar19) {
                cVar17 = '\0';
              }
              goto LAB_00188912;
            }
            cVar17 = '\x01';
            goto LAB_00188910;
          }
        }
LAB_00188912:
      } while (bVar19);
      if (cVar17 == '\0') {
        cVar17 = '\x01';
        mVar8 = 0;
      }
      else {
        cVar17 = '\x01';
        mVar7 = ma_dr_flac__read_uint8(bs,1,&local_7d);
        mVar8 = 0;
        if (mVar7 != 0) {
          if (local_7d == 1) goto LAB_00188964;
          bVar15 = ""[~(uint)local_7d & 1] ^ 0x9c;
          cVar17 = '\x01';
          local_7e = bVar15;
          mVar7 = ma_dr_flac__read_uint8(bs,1,&local_74);
          if (mVar7 == 0) goto LAB_00188f72;
          local_72 = local_74;
          bVar15 = bVar15 * '\x02' ^ ""[(byte)(local_74 & 1 ^ bVar15 >> 7)];
          local_7e = bVar15;
          mVar7 = ma_dr_flac__read_uint8(bs,4,&local_75);
          if (mVar7 == 0) goto LAB_00188aa3;
          if (local_75 == 0) {
LAB_00188a97:
            cVar17 = '\x03';
            mVar8 = local_7c;
            goto LAB_00188f74;
          }
          local_58 = (uint)local_75;
          bVar16 = ""[(byte)(local_75 & 0xf ^ bVar15 >> 4)];
          bVar15 = bVar15 << 4 ^ bVar16;
          local_7e = bVar15;
          mVar7 = ma_dr_flac__read_uint8(bs,4,&local_76);
          if (mVar7 != 0) {
            local_68 = (ulong)local_76;
            bVar15 = ""[(byte)(local_76 & 0xf ^ bVar15 >> 4)];
            bVar16 = bVar16 << 4 ^ bVar15;
            local_7e = bVar16;
            mVar7 = ma_dr_flac__read_uint8(bs,4,&local_77);
            if (mVar7 != 0) {
              if (10 < local_77) goto LAB_00188a97;
              local_73 = local_77;
              local_7e = bVar15 << 4 ^ ""[(byte)(bVar16 >> 4 ^ local_77)];
              local_40 = (ulong)local_7e;
              mVar7 = ma_dr_flac__read_uint8(bs,3,&local_78);
              if (mVar7 == 0) goto LAB_00188f74;
              uVar14 = (ulong)local_78;
              if ((local_78 & 0xfb) == 3) {
LAB_00188964:
                cVar17 = '\x03';
                mVar8 = local_7c;
                goto LAB_00188f74;
              }
              bVar15 = (char)local_40 * '\b' ^ ""[local_78 & 7 ^ (byte)(local_40 >> 5) & 7];
              local_7e = bVar15;
              mVar8 = ma_dr_flac__read_uint8(bs,1,&local_7d);
              if (mVar8 == 0) goto LAB_00188f72;
              if (local_7d == 1) goto LAB_00188964;
              local_7e = bVar15 * '\x02' ^ ""[(byte)(local_7d & 1 ^ bVar15 >> 7)];
              local_48 = uVar14;
              if (local_72 == 1) {
                mVar9 = ma_dr_flac__read_utf8_coded_number(bs,&local_60,&local_7e);
                if (mVar9 != MA_SUCCESS) goto LAB_00188bbe;
                local_70->flacFrameNumber = 0;
                local_70->pcmFrameNumber = local_60;
LAB_00188bec:
                cVar17 = '\0';
              }
              else {
                local_60 = 0;
                mVar9 = ma_dr_flac__read_utf8_coded_number(bs,&local_60,&local_7e);
                if (mVar9 == MA_SUCCESS) {
                  local_70->flacFrameNumber = (ma_uint32)local_60;
                  local_70->pcmFrameNumber = 0;
                  goto LAB_00188bec;
                }
LAB_00188bbe:
                cVar17 = (mVar9 != MA_AT_END) * '\x02' + '\x01';
                if (mVar9 == MA_AT_END) {
                  local_7c = 0;
                }
              }
              pmVar5 = local_38;
              pmVar18 = local_70;
              mVar8 = local_7c;
              if (mVar9 != MA_SUCCESS) goto LAB_00188f74;
              if (local_58 != 1) {
                if ((byte)local_58 < 6) {
                  iVar10 = 0x90;
                  uVar13 = local_58;
LAB_00188ccb:
                  local_70->blockSizeInPCMFrames = (ma_uint16)(iVar10 << ((byte)uVar13 & 0x1f));
                  goto LAB_00188cd2;
                }
                if (local_58 == 7) {
                  mVar8 = ma_dr_flac__read_uint16(bs,0x10,local_38);
                  if (mVar8 != 0) {
                    mVar1 = *pmVar5;
                    local_7e = ""[(byte)((byte)mVar1 ^ ""[(byte)((byte)(mVar1 >> 8) ^ local_7e)])];
                    if (mVar1 != 0xffff) goto LAB_00188cbe;
                  }
                }
                else {
                  if (local_58 != 6) {
                    uVar13 = (uint)(byte)((byte)local_58 - 8);
                    iVar10 = 0x100;
                    goto LAB_00188ccb;
                  }
                  mVar8 = ma_dr_flac__read_uint16(bs,8,local_38);
                  if (mVar8 != 0) {
                    local_7e = ""[(byte)(local_7e ^ (byte)*(undefined4 *)pmVar5)];
                    mVar1 = (ma_uint16)*(undefined4 *)pmVar5;
LAB_00188cbe:
                    *pmVar5 = mVar1 + 1;
                    goto LAB_00188cd2;
                  }
                }
                goto LAB_00188f72;
              }
              local_70->blockSizeInPCMFrames = 0xc0;
LAB_00188cd2:
              if ((byte)local_68 < 0xc) {
                mVar12 = *(ma_uint32 *)(&DAT_0019ff30 + local_68 * 4);
LAB_00188cec:
                pmVar18->sampleRate = mVar12;
LAB_00188cf0:
                pmVar18->channelAssignment = local_73;
                mVar6 = (&DAT_0019dc60)[local_48];
                if (local_48 == 0) {
                  mVar6 = (ma_uint8)local_54;
                }
                pmVar18->bitsPerSample = mVar6;
                if (mVar6 == (ma_uint8)local_54) {
                  mVar7 = ma_dr_flac__read_uint8(bs,8,local_50);
                  cVar17 = '\x01';
                  mVar8 = 0;
                  if (mVar7 != 0) {
                    cVar17 = (*local_50 != local_7e) * '\x02' + '\x01';
                    mVar8 = local_7c;
                    if (*local_50 == local_7e) {
                      mVar8 = 1;
                    }
                  }
                  goto LAB_00188f74;
                }
              }
              else if (local_68 == 0xe) {
                if ((bs->consumedBits != 0x40) || (mVar8 = ma_dr_flac__reload_cache(bs), mVar8 != 0)
                   ) {
                  uVar13 = bs->consumedBits;
                  uVar14 = 0x40 - (ulong)uVar13;
                  if (uVar14 < 0x10) {
                    uVar2 = bs->cache;
                    mVar8 = ma_dr_flac__reload_cache(bs);
                    if ((mVar8 == 0) ||
                       (uVar11 = 0x10 - (int)uVar14, 0x40 - (ulong)bs->consumedBits < (ulong)uVar11)
                       ) goto LAB_00188f72;
                    bVar15 = (byte)uVar11;
                    uVar3 = bs->cache;
                    local_70->sampleRate =
                         (uint)((~(0xffffffffffffffffU >> (bVar15 & 0x3f)) & uVar3) >>
                               (-bVar15 & 0x3f)) |
                         (int)((~(0xffffffffffffffffU >> ((byte)uVar14 & 0x3f)) & uVar2) >>
                              ((byte)uVar13 & 0x3f)) << (bVar15 & 0x1f);
                    bs->consumedBits = bs->consumedBits + uVar11;
                    bs->cache = uVar3 << (bVar15 & 0x3f);
                    pmVar18 = local_70;
                  }
                  else {
                    mVar4 = bs->cache;
                    pmVar18->sampleRate = (uint)(ushort)(mVar4 >> 0x30);
                    bs->consumedBits = bs->consumedBits + 0x10;
                    bs->cache = mVar4 << 0x10;
                  }
                  mVar12 = pmVar18->sampleRate;
                  local_7e = ""[(byte)(""[(byte)((byte)(mVar12 >> 8) ^ local_7e)] ^ (byte)mVar12)];
                  mVar12 = mVar12 * 10;
                  goto LAB_00188cec;
                }
              }
              else if ((int)local_68 == 0xd) {
                if ((bs->consumedBits != 0x40) || (mVar8 = ma_dr_flac__reload_cache(bs), mVar8 != 0)
                   ) {
                  uVar13 = bs->consumedBits;
                  uVar14 = 0x40 - (ulong)uVar13;
                  if (uVar14 < 0x10) {
                    uVar2 = bs->cache;
                    mVar8 = ma_dr_flac__reload_cache(bs);
                    if ((mVar8 == 0) ||
                       (uVar11 = 0x10 - (int)uVar14, 0x40 - (ulong)bs->consumedBits < (ulong)uVar11)
                       ) goto LAB_00188f72;
                    bVar15 = (byte)uVar11;
                    uVar3 = bs->cache;
                    local_70->sampleRate =
                         (uint)((~(0xffffffffffffffffU >> (bVar15 & 0x3f)) & uVar3) >>
                               (-bVar15 & 0x3f)) |
                         (int)((~(0xffffffffffffffffU >> ((byte)uVar14 & 0x3f)) & uVar2) >>
                              ((byte)uVar13 & 0x3f)) << (bVar15 & 0x1f);
                    bs->consumedBits = bs->consumedBits + uVar11;
                    bs->cache = uVar3 << (bVar15 & 0x3f);
                    pmVar18 = local_70;
                  }
                  else {
                    mVar4 = bs->cache;
                    pmVar18->sampleRate = (uint)(ushort)(mVar4 >> 0x30);
                    bs->consumedBits = bs->consumedBits + 0x10;
                    bs->cache = mVar4 << 0x10;
                  }
                  local_7e = ""[(byte)((byte)pmVar18->sampleRate ^
                                      ""[(byte)((byte)(pmVar18->sampleRate >> 8) ^ local_7e)])];
                  goto LAB_00188cf0;
                }
              }
              else {
                if ((int)local_68 != 0xc) {
                  cVar17 = '\x03';
                  mVar8 = local_7c;
                  goto LAB_00188f74;
                }
                if ((bs->consumedBits != 0x40) || (mVar8 = ma_dr_flac__reload_cache(bs), mVar8 != 0)
                   ) {
                  uVar13 = bs->consumedBits;
                  uVar14 = 0x40 - (ulong)uVar13;
                  if (uVar14 < 8) {
                    uVar2 = bs->cache;
                    mVar8 = ma_dr_flac__reload_cache(bs);
                    if ((mVar8 == 0) ||
                       (uVar11 = 8 - (int)uVar14, 0x40 - (ulong)bs->consumedBits < (ulong)uVar11))
                    goto LAB_00188f72;
                    bVar15 = (byte)uVar11;
                    uVar3 = bs->cache;
                    local_70->sampleRate =
                         (uint)((~(0xffffffffffffffffU >> (bVar15 & 0x3f)) & uVar3) >>
                               (-bVar15 & 0x3f)) |
                         (int)((~(0xffffffffffffffffU >> ((byte)uVar14 & 0x3f)) & uVar2) >>
                              ((byte)uVar13 & 0x3f)) << (bVar15 & 0x1f);
                    bs->consumedBits = bs->consumedBits + uVar11;
                    bs->cache = uVar3 << (bVar15 & 0x3f);
                    pmVar18 = local_70;
                  }
                  else {
                    mVar4 = bs->cache;
                    pmVar18->sampleRate = (uint)(byte)(mVar4 >> 0x38);
                    bs->consumedBits = bs->consumedBits + 8;
                    bs->cache = mVar4 << 8;
                  }
                  local_7e = ""[(byte)(local_7e ^ (byte)pmVar18->sampleRate)];
                  mVar12 = pmVar18->sampleRate * 1000;
                  goto LAB_00188cec;
                }
              }
LAB_00188f72:
              cVar17 = '\x01';
              mVar8 = 0;
              goto LAB_00188f74;
            }
          }
LAB_00188aa3:
          mVar8 = 0;
        }
      }
    }
LAB_00188f74:
    local_7c = mVar8;
    if (cVar17 != '\x03') {
      return local_7c;
    }
  } while( true );
}

Assistant:

static ma_bool32 ma_dr_flac__read_next_flac_frame_header(ma_dr_flac_bs* bs, ma_uint8 streaminfoBitsPerSample, ma_dr_flac_frame_header* header)
{
    const ma_uint32 sampleRateTable[12]  = {0, 88200, 176400, 192000, 8000, 16000, 22050, 24000, 32000, 44100, 48000, 96000};
    const ma_uint8 bitsPerSampleTable[8] = {0, 8, 12, (ma_uint8)-1, 16, 20, 24, (ma_uint8)-1};
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(header != NULL);
    for (;;) {
        ma_uint8 crc8 = 0xCE;
        ma_uint8 reserved = 0;
        ma_uint8 blockingStrategy = 0;
        ma_uint8 blockSize = 0;
        ma_uint8 sampleRate = 0;
        ma_uint8 channelAssignment = 0;
        ma_uint8 bitsPerSample = 0;
        ma_bool32 isVariableBlockSize;
        if (!ma_dr_flac__find_and_seek_to_next_sync_code(bs)) {
            return MA_FALSE;
        }
        if (!ma_dr_flac__read_uint8(bs, 1, &reserved)) {
            return MA_FALSE;
        }
        if (reserved == 1) {
            continue;
        }
        crc8 = ma_dr_flac_crc8(crc8, reserved, 1);
        if (!ma_dr_flac__read_uint8(bs, 1, &blockingStrategy)) {
            return MA_FALSE;
        }
        crc8 = ma_dr_flac_crc8(crc8, blockingStrategy, 1);
        if (!ma_dr_flac__read_uint8(bs, 4, &blockSize)) {
            return MA_FALSE;
        }
        if (blockSize == 0) {
            continue;
        }
        crc8 = ma_dr_flac_crc8(crc8, blockSize, 4);
        if (!ma_dr_flac__read_uint8(bs, 4, &sampleRate)) {
            return MA_FALSE;
        }
        crc8 = ma_dr_flac_crc8(crc8, sampleRate, 4);
        if (!ma_dr_flac__read_uint8(bs, 4, &channelAssignment)) {
            return MA_FALSE;
        }
        if (channelAssignment > 10) {
            continue;
        }
        crc8 = ma_dr_flac_crc8(crc8, channelAssignment, 4);
        if (!ma_dr_flac__read_uint8(bs, 3, &bitsPerSample)) {
            return MA_FALSE;
        }
        if (bitsPerSample == 3 || bitsPerSample == 7) {
            continue;
        }
        crc8 = ma_dr_flac_crc8(crc8, bitsPerSample, 3);
        if (!ma_dr_flac__read_uint8(bs, 1, &reserved)) {
            return MA_FALSE;
        }
        if (reserved == 1) {
            continue;
        }
        crc8 = ma_dr_flac_crc8(crc8, reserved, 1);
        isVariableBlockSize = blockingStrategy == 1;
        if (isVariableBlockSize) {
            ma_uint64 pcmFrameNumber;
            ma_result result = ma_dr_flac__read_utf8_coded_number(bs, &pcmFrameNumber, &crc8);
            if (result != MA_SUCCESS) {
                if (result == MA_AT_END) {
                    return MA_FALSE;
                } else {
                    continue;
                }
            }
            header->flacFrameNumber  = 0;
            header->pcmFrameNumber = pcmFrameNumber;
        } else {
            ma_uint64 flacFrameNumber = 0;
            ma_result result = ma_dr_flac__read_utf8_coded_number(bs, &flacFrameNumber, &crc8);
            if (result != MA_SUCCESS) {
                if (result == MA_AT_END) {
                    return MA_FALSE;
                } else {
                    continue;
                }
            }
            header->flacFrameNumber  = (ma_uint32)flacFrameNumber;
            header->pcmFrameNumber = 0;
        }
        MA_DR_FLAC_ASSERT(blockSize > 0);
        if (blockSize == 1) {
            header->blockSizeInPCMFrames = 192;
        } else if (blockSize <= 5) {
            MA_DR_FLAC_ASSERT(blockSize >= 2);
            header->blockSizeInPCMFrames = 576 * (1 << (blockSize - 2));
        } else if (blockSize == 6) {
            if (!ma_dr_flac__read_uint16(bs, 8, &header->blockSizeInPCMFrames)) {
                return MA_FALSE;
            }
            crc8 = ma_dr_flac_crc8(crc8, header->blockSizeInPCMFrames, 8);
            header->blockSizeInPCMFrames += 1;
        } else if (blockSize == 7) {
            if (!ma_dr_flac__read_uint16(bs, 16, &header->blockSizeInPCMFrames)) {
                return MA_FALSE;
            }
            crc8 = ma_dr_flac_crc8(crc8, header->blockSizeInPCMFrames, 16);
            if (header->blockSizeInPCMFrames == 0xFFFF) {
                return MA_FALSE;
            }
            header->blockSizeInPCMFrames += 1;
        } else {
            MA_DR_FLAC_ASSERT(blockSize >= 8);
            header->blockSizeInPCMFrames = 256 * (1 << (blockSize - 8));
        }
        if (sampleRate <= 11) {
            header->sampleRate = sampleRateTable[sampleRate];
        } else if (sampleRate == 12) {
            if (!ma_dr_flac__read_uint32(bs, 8, &header->sampleRate)) {
                return MA_FALSE;
            }
            crc8 = ma_dr_flac_crc8(crc8, header->sampleRate, 8);
            header->sampleRate *= 1000;
        } else if (sampleRate == 13) {
            if (!ma_dr_flac__read_uint32(bs, 16, &header->sampleRate)) {
                return MA_FALSE;
            }
            crc8 = ma_dr_flac_crc8(crc8, header->sampleRate, 16);
        } else if (sampleRate == 14) {
            if (!ma_dr_flac__read_uint32(bs, 16, &header->sampleRate)) {
                return MA_FALSE;
            }
            crc8 = ma_dr_flac_crc8(crc8, header->sampleRate, 16);
            header->sampleRate *= 10;
        } else {
            continue;
        }
        header->channelAssignment = channelAssignment;
        header->bitsPerSample = bitsPerSampleTable[bitsPerSample];
        if (header->bitsPerSample == 0) {
            header->bitsPerSample = streaminfoBitsPerSample;
        }
        if (header->bitsPerSample != streaminfoBitsPerSample) {
            return MA_FALSE;
        }
        if (!ma_dr_flac__read_uint8(bs, 8, &header->crc8)) {
            return MA_FALSE;
        }
#ifndef MA_DR_FLAC_NO_CRC
        if (header->crc8 != crc8) {
            continue;
        }
#endif
        return MA_TRUE;
    }
}